

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_buildSeqStore(ZSTD_CCtx *zc,void *src,size_t srcSize)

{
  ZSTD_matchState_t *ms;
  seqStore_t *seqStore;
  BYTE **ppBVar1;
  U32 UVar2;
  ZSTD_paramSwitch_e ZVar3;
  ZSTD_compressedBlockState_t *pZVar4;
  ZSTD_sequenceProducer_F *pZVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  ZSTD_compressionParameters cParams1;
  ZSTD_compressionParameters cParams2;
  int i;
  uint uVar17;
  ZSTD_dictMode_e dictMode;
  long lVar18;
  size_t sVar19;
  ulong inSeqsSize;
  ZSTD_blockCompressor p_Var20;
  U32 *rep;
  ulong uVar21;
  uint uVar22;
  ZSTD_Sequence *pZVar23;
  uint *puVar24;
  long lVar25;
  ulong uVar26;
  bool bVar27;
  undefined4 in_stack_ffffffffffffff74;
  undefined8 in_stack_ffffffffffffff94;
  ZSTD_sequencePosition seqPos;
  undefined4 uStack_48;
  
  if (0x20000 < srcSize) {
    __assert_fail("srcSize <= ZSTD_BLOCKSIZE_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5d07,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
  }
  seqPos.idx = (zc->appliedParams).cParams.windowLog;
  seqPos.posInSequence = (zc->appliedParams).cParams.chainLog;
  uVar6 = (zc->appliedParams).cParams.hashLog;
  uVar7 = (zc->appliedParams).cParams.searchLog;
  cParams1.chainLog = uVar7;
  cParams1.windowLog = uVar6;
  uVar8 = (zc->appliedParams).cParams.minMatch;
  uVar9 = (zc->appliedParams).cParams.targetLength;
  uVar10 = (zc->appliedParams).cParams.strategy;
  uVar11 = (zc->blockState).matchState.cParams.windowLog;
  uVar12 = (zc->blockState).matchState.cParams.hashLog;
  uVar13 = (zc->blockState).matchState.cParams.searchLog;
  cParams2.chainLog = uVar13;
  cParams2.windowLog = uVar12;
  uVar14 = (zc->blockState).matchState.cParams.minMatch;
  uVar15 = (zc->blockState).matchState.cParams.targetLength;
  uVar16 = (zc->blockState).matchState.cParams.strategy;
  cParams2.minMatch = uVar16;
  cParams2.searchLog = uVar15;
  cParams1.hashLog = uVar8;
  cParams1.searchLog = uVar9;
  cParams1.minMatch = uVar10;
  cParams1.targetLength = in_stack_ffffffffffffff74;
  cParams1.strategy = uVar11;
  cParams2.hashLog = uVar14;
  cParams2._20_8_ = in_stack_ffffffffffffff94;
  seqPos.posInSrc._0_4_ = uVar6;
  seqPos.posInSrc._4_4_ = uVar7;
  ZSTD_assertEqualCParams(cParams1,cParams2);
  if (srcSize < 7) {
    if ((zc->appliedParams).cParams.strategy < ZSTD_btopt) {
      ZSTD_ldm_skipSequences(&zc->externSeqStore,srcSize,(zc->appliedParams).cParams.minMatch);
    }
    else {
      ZSTD_ldm_skipRawSeqStoreBytes(&zc->externSeqStore,srcSize);
    }
    return 1;
  }
  (zc->seqStore).lit = (zc->seqStore).litStart;
  (zc->seqStore).sequences = (zc->seqStore).sequencesStart;
  (zc->seqStore).longLengthType = ZSTD_llt_none;
  pZVar4 = (zc->blockState).prevCBlock;
  (zc->blockState).matchState.opt.symbolCosts = &pZVar4->entropy;
  (zc->blockState).matchState.opt.literalCompressionMode =
       (zc->appliedParams).literalCompressionMode;
  if (((zc->blockState).matchState.dictMatchState != (ZSTD_matchState_t *)0x0) &&
     ((zc->blockState).matchState.loadedDictEnd != (zc->blockState).matchState.window.dictLimit)) {
    __assert_fail("ms->dictMatchState == NULL || ms->loadedDictEnd == ms->window.dictLimit",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5d1c,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
  }
  lVar18 = (long)src - (long)(zc->blockState).matchState.window.base;
  if (0xfffffffe < lVar18) {
    __assert_fail("istart - base < (ptrdiff_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5d22,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
  }
  ms = &(zc->blockState).matchState;
  UVar2 = (zc->blockState).matchState.nextToUpdate;
  uVar17 = (uint)lVar18;
  if (UVar2 + 0x180 < uVar17) {
    uVar22 = (uVar17 - UVar2) - 0x180;
    if (0xbf < uVar22) {
      uVar22 = 0xc0;
    }
    (zc->blockState).matchState.nextToUpdate = uVar17 - uVar22;
  }
  seqStore = &zc->seqStore;
  dictMode = ZSTD_matchState_dictMode(ms);
  rep = ((zc->blockState).nextCBlock)->rep;
  for (lVar18 = 0; lVar18 != 3; lVar18 = lVar18 + 1) {
    rep[lVar18] = pZVar4->rep[lVar18];
  }
  ZVar3 = (zc->appliedParams).ldmParams.enableLdm;
  if ((zc->externSeqStore).pos < (zc->externSeqStore).size) {
    if (ZVar3 != ZSTD_ps_disable) {
      __assert_fail("zc->appliedParams.ldmParams.enableLdm == ZSTD_ps_disable",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5d2f,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
    }
    if ((zc->appliedParams).useSequenceProducer != 0) {
      return 0xffffffffffffffd7;
    }
    sVar19 = ZSTD_ldm_blockCompress
                       (&zc->externSeqStore,ms,seqStore,rep,(zc->appliedParams).useRowMatchFinder,
                        src,srcSize);
    if ((zc->externSeqStore).size < (zc->externSeqStore).pos) {
      __assert_fail("zc->externSeqStore.pos <= zc->externSeqStore.size",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5d40,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
    }
    goto LAB_001848b5;
  }
  if (ZVar3 == ZSTD_ps_enable) {
    seqPos.posInSrc._0_4_ = 0;
    seqPos.posInSrc._4_4_ = 0;
    if ((zc->appliedParams).useSequenceProducer != 0) {
      return 0xffffffffffffffd7;
    }
    seqPos._0_8_ = zc->ldmSequences;
    sVar19 = ZSTD_ldm_generateSequences
                       (&zc->ldmState,(rawSeqStore_t *)&seqPos,&(zc->appliedParams).ldmParams,src,
                        srcSize);
    if (0xffffffffffffff88 < sVar19) {
      return sVar19;
    }
    sVar19 = ZSTD_ldm_blockCompress
                       ((rawSeqStore_t *)&seqPos,ms,seqStore,((zc->blockState).nextCBlock)->rep,
                        (zc->appliedParams).useRowMatchFinder,src,srcSize);
    if (CONCAT44(seqPos.posInSrc._4_4_,(undefined4)seqPos.posInSrc) != 0) {
      __assert_fail("ldmSeqStore.pos == ldmSeqStore.size",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5d59,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
    }
    goto LAB_001848b5;
  }
  if ((zc->appliedParams).useSequenceProducer != 0) {
    uVar26 = (zc->externalMatchCtx).seqBufferCapacity;
    if (uVar26 <= srcSize / 3) {
      __assert_fail("zc->externalMatchCtx.seqBufferCapacity >= ZSTD_sequenceBound(srcSize)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5d5d,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
    }
    pZVar5 = (zc->externalMatchCtx).mFinder;
    if (pZVar5 == (ZSTD_sequenceProducer_F *)0x0) {
      __assert_fail("zc->externalMatchCtx.mFinder != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5d5e,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
    }
    inSeqsSize = (*pZVar5)((zc->externalMatchCtx).mState,(zc->externalMatchCtx).seqBuffer,uVar26,src
                           ,srcSize,(void *)0x0,0,(zc->appliedParams).compressionLevel,
                           1L << ((byte)(zc->appliedParams).cParams.windowLog & 0x3f));
    uVar26 = (zc->externalMatchCtx).seqBufferCapacity;
    uVar21 = 0xffffffffffffff96;
    if (inSeqsSize - 1 < uVar26) {
      pZVar23 = (zc->externalMatchCtx).seqBuffer;
      if (pZVar23[inSeqsSize - 1].matchLength != 0 || pZVar23[inSeqsSize - 1].offset != 0) {
        if (inSeqsSize == uVar26) goto LAB_00184872;
        pZVar23 = pZVar23 + inSeqsSize;
        pZVar23->offset = 0;
        pZVar23->litLength = 0;
        pZVar23->matchLength = 0;
        pZVar23->rep = 0;
        inSeqsSize = inSeqsSize + 1;
      }
      uVar21 = inSeqsSize;
      if (inSeqsSize < 0xffffffffffffff89) {
        seqPos.idx = 0;
        seqPos.posInSequence = 0;
        seqPos.posInSrc._0_4_ = 0;
        seqPos.posInSrc._4_4_ = 0;
        pZVar23 = (zc->externalMatchCtx).seqBuffer;
        puVar24 = &pZVar23->matchLength;
        lVar18 = 0;
        lVar25 = 0;
        uVar26 = inSeqsSize;
        while (bVar27 = uVar26 != 0, uVar26 = uVar26 - 1, bVar27) {
          lVar25 = lVar25 + (ulong)puVar24[-1];
          lVar18 = lVar18 + (ulong)*puVar24;
          puVar24 = puVar24 + 4;
        }
        if ((ulong)(lVar25 + lVar18) <= srcSize) {
          sVar19 = ZSTD_copySequencesToSeqStoreExplicitBlockDelim
                             (zc,&seqPos,pZVar23,inSeqsSize,src,srcSize,
                              (zc->appliedParams).searchForExternalRepcodes);
          if (sVar19 < 0xffffffffffffff89) {
            (zc->blockState).matchState.ldmSeqStore = (rawSeqStore_t *)0x0;
            return 0;
          }
          return sVar19;
        }
        return 0xffffffffffffff95;
      }
    }
LAB_00184872:
    if ((zc->appliedParams).enableMatchFinderFallback == 0) {
      return uVar21;
    }
  }
  p_Var20 = ZSTD_selectBlockCompressor
                      ((zc->appliedParams).cParams.strategy,(zc->appliedParams).useRowMatchFinder,
                       dictMode);
  (zc->blockState).matchState.ldmSeqStore = (rawSeqStore_t *)0x0;
  sVar19 = (*p_Var20)(ms,seqStore,((zc->blockState).nextCBlock)->rep,src,srcSize);
LAB_001848b5:
  memcpy((zc->seqStore).lit,(void *)((long)src + (srcSize - sVar19)),sVar19);
  ppBVar1 = &(zc->seqStore).lit;
  *ppBVar1 = *ppBVar1 + sVar19;
  return 0;
}

Assistant:

static size_t ZSTD_buildSeqStore(ZSTD_CCtx* zc, const void* src, size_t srcSize)
{
    ZSTD_matchState_t* const ms = &zc->blockState.matchState;
    DEBUGLOG(5, "ZSTD_buildSeqStore (srcSize=%zu)", srcSize);
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);
    /* Assert that we have correctly flushed the ctx params into the ms's copy */
    ZSTD_assertEqualCParams(zc->appliedParams.cParams, ms->cParams);
    /* TODO: See 3090. We reduced MIN_CBLOCK_SIZE from 3 to 2 so to compensate we are adding
     * additional 1. We need to revisit and change this logic to be more consistent */
    if (srcSize < MIN_CBLOCK_SIZE+ZSTD_blockHeaderSize+1+1) {
        if (zc->appliedParams.cParams.strategy >= ZSTD_btopt) {
            ZSTD_ldm_skipRawSeqStoreBytes(&zc->externSeqStore, srcSize);
        } else {
            ZSTD_ldm_skipSequences(&zc->externSeqStore, srcSize, zc->appliedParams.cParams.minMatch);
        }
        return ZSTDbss_noCompress; /* don't even attempt compression below a certain srcSize */
    }
    ZSTD_resetSeqStore(&(zc->seqStore));
    /* required for optimal parser to read stats from dictionary */
    ms->opt.symbolCosts = &zc->blockState.prevCBlock->entropy;
    /* tell the optimal parser how we expect to compress literals */
    ms->opt.literalCompressionMode = zc->appliedParams.literalCompressionMode;
    /* a gap between an attached dict and the current window is not safe,
     * they must remain adjacent,
     * and when that stops being the case, the dict must be unset */
    assert(ms->dictMatchState == NULL || ms->loadedDictEnd == ms->window.dictLimit);

    /* limited update after a very long match */
    {   const BYTE* const base = ms->window.base;
        const BYTE* const istart = (const BYTE*)src;
        const U32 curr = (U32)(istart-base);
        if (sizeof(ptrdiff_t)==8) assert(istart - base < (ptrdiff_t)(U32)(-1));   /* ensure no overflow */
        if (curr > ms->nextToUpdate + 384)
            ms->nextToUpdate = curr - MIN(192, (U32)(curr - ms->nextToUpdate - 384));
    }

    /* select and store sequences */
    {   ZSTD_dictMode_e const dictMode = ZSTD_matchState_dictMode(ms);
        size_t lastLLSize;
        {   int i;
            for (i = 0; i < ZSTD_REP_NUM; ++i)
                zc->blockState.nextCBlock->rep[i] = zc->blockState.prevCBlock->rep[i];
        }
        if (zc->externSeqStore.pos < zc->externSeqStore.size) {
            assert(zc->appliedParams.ldmParams.enableLdm == ZSTD_ps_disable);

            /* External matchfinder + LDM is technically possible, just not implemented yet.
             * We need to revisit soon and implement it. */
            RETURN_ERROR_IF(
                zc->appliedParams.useSequenceProducer,
                parameter_combination_unsupported,
                "Long-distance matching with external sequence producer enabled is not currently supported."
            );

            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&zc->externSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       zc->appliedParams.useRowMatchFinder,
                                       src, srcSize);
            assert(zc->externSeqStore.pos <= zc->externSeqStore.size);
        } else if (zc->appliedParams.ldmParams.enableLdm == ZSTD_ps_enable) {
            rawSeqStore_t ldmSeqStore = kNullRawSeqStore;

            /* External matchfinder + LDM is technically possible, just not implemented yet.
             * We need to revisit soon and implement it. */
            RETURN_ERROR_IF(
                zc->appliedParams.useSequenceProducer,
                parameter_combination_unsupported,
                "Long-distance matching with external sequence producer enabled is not currently supported."
            );

            ldmSeqStore.seq = zc->ldmSequences;
            ldmSeqStore.capacity = zc->maxNbLdmSequences;
            /* Updates ldmSeqStore.size */
            FORWARD_IF_ERROR(ZSTD_ldm_generateSequences(&zc->ldmState, &ldmSeqStore,
                                               &zc->appliedParams.ldmParams,
                                               src, srcSize), "");
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&ldmSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       zc->appliedParams.useRowMatchFinder,
                                       src, srcSize);
            assert(ldmSeqStore.pos == ldmSeqStore.size);
        } else if (zc->appliedParams.useSequenceProducer) {
            assert(
                zc->externalMatchCtx.seqBufferCapacity >= ZSTD_sequenceBound(srcSize)
            );
            assert(zc->externalMatchCtx.mFinder != NULL);

            {   U32 const windowSize = (U32)1 << zc->appliedParams.cParams.windowLog;

                size_t const nbExternalSeqs = (zc->externalMatchCtx.mFinder)(
                    zc->externalMatchCtx.mState,
                    zc->externalMatchCtx.seqBuffer,
                    zc->externalMatchCtx.seqBufferCapacity,
                    src, srcSize,
                    NULL, 0,  /* dict and dictSize, currently not supported */
                    zc->appliedParams.compressionLevel,
                    windowSize
                );

                size_t const nbPostProcessedSeqs = ZSTD_postProcessSequenceProducerResult(
                    zc->externalMatchCtx.seqBuffer,
                    nbExternalSeqs,
                    zc->externalMatchCtx.seqBufferCapacity,
                    srcSize
                );

                /* Return early if there is no error, since we don't need to worry about last literals */
                if (!ZSTD_isError(nbPostProcessedSeqs)) {
                    ZSTD_sequencePosition seqPos = {0,0,0};
                    size_t const seqLenSum = ZSTD_fastSequenceLengthSum(zc->externalMatchCtx.seqBuffer, nbPostProcessedSeqs);
                    RETURN_ERROR_IF(seqLenSum > srcSize, externalSequences_invalid, "External sequences imply too large a block!");
                    FORWARD_IF_ERROR(
                        ZSTD_copySequencesToSeqStoreExplicitBlockDelim(
                            zc, &seqPos,
                            zc->externalMatchCtx.seqBuffer, nbPostProcessedSeqs,
                            src, srcSize,
                            zc->appliedParams.searchForExternalRepcodes
                        ),
                        "Failed to copy external sequences to seqStore!"
                    );
                    ms->ldmSeqStore = NULL;
                    DEBUGLOG(5, "Copied %lu sequences from external sequence producer to internal seqStore.", (unsigned long)nbExternalSeqs);
                    return ZSTDbss_compress;
                }

                /* Propagate the error if fallback is disabled */
                if (!zc->appliedParams.enableMatchFinderFallback) {
                    return nbPostProcessedSeqs;
                }

                /* Fallback to software matchfinder */
                {   ZSTD_blockCompressor const blockCompressor = ZSTD_selectBlockCompressor(zc->appliedParams.cParams.strategy,
                                                                                            zc->appliedParams.useRowMatchFinder,
                                                                                            dictMode);
                    ms->ldmSeqStore = NULL;
                    DEBUGLOG(
                        5,
                        "External sequence producer returned error code %lu. Falling back to internal parser.",
                        (unsigned long)nbExternalSeqs
                    );
                    lastLLSize = blockCompressor(ms, &zc->seqStore, zc->blockState.nextCBlock->rep, src, srcSize);
            }   }
        } else {   /* not long range mode and no external matchfinder */
            ZSTD_blockCompressor const blockCompressor = ZSTD_selectBlockCompressor(zc->appliedParams.cParams.strategy,
                                                                                    zc->appliedParams.useRowMatchFinder,
                                                                                    dictMode);
            ms->ldmSeqStore = NULL;
            lastLLSize = blockCompressor(ms, &zc->seqStore, zc->blockState.nextCBlock->rep, src, srcSize);
        }
        {   const BYTE* const lastLiterals = (const BYTE*)src + srcSize - lastLLSize;
            ZSTD_storeLastLiterals(&zc->seqStore, lastLiterals, lastLLSize);
    }   }
    return ZSTDbss_compress;
}